

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFACompareAtoms(xmlRegAtomPtr atom1,xmlRegAtomPtr atom2,int deep)

{
  xmlChar *str;
  xmlChar *str_00;
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlRegRangePtr r2;
  xmlRegRangePtr r1;
  int local_50;
  int res;
  int j;
  int i;
  int compound2;
  int compound1;
  xmlChar *val2;
  xmlChar *val1;
  xmlRegAtomPtr tmp;
  int ret;
  int deep_local;
  xmlRegAtomPtr atom2_local;
  xmlRegAtomPtr atom1_local;
  
  tmp._0_4_ = 1;
  if (atom1 == atom2) {
    return 1;
  }
  if ((atom1 == (xmlRegAtomPtr)0x0) || (atom2 == (xmlRegAtomPtr)0x0)) {
    return 0;
  }
  if ((atom1->type == XML_REGEXP_ANYCHAR) || (atom2->type == XML_REGEXP_ANYCHAR)) {
    return 1;
  }
  _ret = atom2;
  atom2_local = atom1;
  if (atom2->type < atom1->type) {
    _ret = atom1;
    atom2_local = atom2;
  }
  if ((atom2_local->type != _ret->type) &&
     (tmp._0_4_ = xmlFACompareAtomTypes(atom2_local->type,_ret->type), (uint)tmp == 0)) {
    return 0;
  }
  switch(atom2_local->type) {
  case XML_REGEXP_EPSILON:
    goto LAB_001f81fb;
  case XML_REGEXP_CHARVAL:
    if (_ret->type == XML_REGEXP_CHARVAL) {
      tmp._0_4_ = (uint)(atom2_local->codepoint == _ret->codepoint);
    }
    else {
      tmp._0_4_ = xmlRegCheckCharacter(_ret,atom2_local->codepoint);
      if ((int)(uint)tmp < 0) {
        tmp._0_4_ = 1;
      }
    }
    break;
  case XML_REGEXP_RANGES:
    if (_ret->type == XML_REGEXP_RANGES) {
      for (res = 0; res < atom2_local->nbRanges; res = res + 1) {
        for (local_50 = 0; local_50 < _ret->nbRanges; local_50 = local_50 + 1) {
          iVar1 = xmlFACompareRanges(atom2_local->ranges[res],_ret->ranges[local_50]);
          if (iVar1 == 1) {
            tmp._0_4_ = 1;
            goto LAB_001f81c9;
          }
        }
      }
      tmp._0_4_ = 0;
    }
    break;
  default:
    goto LAB_001f81fb;
  case XML_REGEXP_STRING:
    if (deep == 0) {
      tmp._0_4_ = (uint)(atom2_local->valuep != _ret->valuep);
    }
    else {
      str = (xmlChar *)atom2_local->valuep;
      str_00 = (xmlChar *)_ret->valuep;
      pxVar2 = xmlStrchr(str,'|');
      pxVar3 = xmlStrchr(str_00,'|');
      if ((pxVar2 != (xmlChar *)0x0) != (pxVar3 != (xmlChar *)0x0)) {
        return 0;
      }
      tmp._0_4_ = xmlRegStrEqualWildcard(str,str_00);
    }
  }
LAB_001f81c9:
  if (atom2_local->neg != _ret->neg) {
    tmp._0_4_ = (uint)(((uint)tmp != 0 ^ 0xffU) & 1);
  }
  if ((uint)tmp == 0) {
    atom1_local._4_4_ = 0;
  }
  else {
LAB_001f81fb:
    atom1_local._4_4_ = 1;
  }
  return atom1_local._4_4_;
}

Assistant:

static int
xmlFACompareAtoms(xmlRegAtomPtr atom1, xmlRegAtomPtr atom2, int deep) {
    int ret = 1;

    if (atom1 == atom2)
	return(1);
    if ((atom1 == NULL) || (atom2 == NULL))
	return(0);

    if ((atom1->type == XML_REGEXP_ANYCHAR) ||
        (atom2->type == XML_REGEXP_ANYCHAR))
	return(1);

    if (atom1->type > atom2->type) {
	xmlRegAtomPtr tmp;
	tmp = atom1;
	atom1 = atom2;
	atom2 = tmp;
    }
    if (atom1->type != atom2->type) {
        ret = xmlFACompareAtomTypes(atom1->type, atom2->type);
	/* if they can't intersect at the type level break now */
	if (ret == 0)
	    return(0);
    }
    switch (atom1->type) {
        case XML_REGEXP_STRING:
            if (!deep)
                ret = (atom1->valuep != atom2->valuep);
            else {
                xmlChar *val1 = (xmlChar *)atom1->valuep;
                xmlChar *val2 = (xmlChar *)atom2->valuep;
                int compound1 = (xmlStrchr(val1, '|') != NULL);
                int compound2 = (xmlStrchr(val2, '|') != NULL);

                /* Ignore negative match flag for ##other namespaces */
                if (compound1 != compound2)
                    return(0);

                ret = xmlRegStrEqualWildcard(val1, val2);
            }
	    break;
        case XML_REGEXP_EPSILON:
	    goto not_determinist;
        case XML_REGEXP_CHARVAL:
	    if (atom2->type == XML_REGEXP_CHARVAL) {
		ret = (atom1->codepoint == atom2->codepoint);
	    } else {
	        ret = xmlRegCheckCharacter(atom2, atom1->codepoint);
		if (ret < 0)
		    ret = 1;
	    }
	    break;
        case XML_REGEXP_RANGES:
	    if (atom2->type == XML_REGEXP_RANGES) {
	        int i, j, res;
		xmlRegRangePtr r1, r2;

		/*
		 * need to check that none of the ranges eventually matches
		 */
		for (i = 0;i < atom1->nbRanges;i++) {
		    for (j = 0;j < atom2->nbRanges;j++) {
			r1 = atom1->ranges[i];
			r2 = atom2->ranges[j];
			res = xmlFACompareRanges(r1, r2);
			if (res == 1) {
			    ret = 1;
			    goto done;
			}
		    }
		}
		ret = 0;
	    }
	    break;
	default:
	    goto not_determinist;
    }
done:
    if (atom1->neg != atom2->neg) {
        ret = !ret;
    }
    if (ret == 0)
        return(0);
not_determinist:
    return(1);
}